

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmELF.cxx
# Opt level: O2

bool __thiscall
cmELFInternalImpl<cmELFTypes64>::LoadDynamicSection(cmELFInternalImpl<cmELFTypes64> *this)

{
  pointer paVar1;
  bool bVar2;
  long lVar3;
  int j;
  long lVar4;
  long lVar5;
  size_type __new_size;
  
  lVar3 = (long)(this->super_cmELFInternal).DynamicSectionIndex;
  if (-1 < lVar3) {
    if ((this->DynamicSectionEntries).super__Vector_base<Elf64_Dyn,_std::allocator<Elf64_Dyn>_>.
        _M_impl.super__Vector_impl_data._M_start !=
        (this->DynamicSectionEntries).super__Vector_base<Elf64_Dyn,_std::allocator<Elf64_Dyn>_>.
        _M_impl.super__Vector_impl_data._M_finish) {
      return true;
    }
    paVar1 = (this->SectionHeaders).super__Vector_base<Elf64_Shdr,_std::allocator<Elf64_Shdr>_>.
             _M_impl.super__Vector_impl_data._M_start;
    if (paVar1[lVar3].sh_entsize != 0) {
      lVar5 = 0;
      __new_size = (size_type)(int)(paVar1[lVar3].sh_size / paVar1[lVar3].sh_entsize);
      std::vector<Elf64_Dyn,_std::allocator<Elf64_Dyn>_>::resize
                (&this->DynamicSectionEntries,__new_size);
      lVar4 = 0;
      do {
        if ((long)__new_size <= lVar4) {
          return true;
        }
        std::istream::seekg((this->super_cmELFInternal).Stream,
                            paVar1[lVar3].sh_entsize * lVar4 + paVar1[lVar3].sh_offset,0);
        bVar2 = Read(this,(ELF_Dyn *)
                          ((long)&((this->DynamicSectionEntries).
                                   super__Vector_base<Elf64_Dyn,_std::allocator<Elf64_Dyn>_>._M_impl
                                   .super__Vector_impl_data._M_start)->d_tag + lVar5));
        lVar4 = lVar4 + 1;
        lVar5 = lVar5 + 0x10;
      } while (bVar2);
      cmELFInternal::SetErrorMessage
                (&this->super_cmELFInternal,"Error reading entry from DYNAMIC section.");
      (this->super_cmELFInternal).DynamicSectionIndex = -1;
    }
  }
  return false;
}

Assistant:

bool cmELFInternalImpl<Types>::LoadDynamicSection()
{
  // If there is no dynamic section we are done.
  if (this->DynamicSectionIndex < 0) {
    return false;
  }

  // If the section was already loaded we are done.
  if (!this->DynamicSectionEntries.empty()) {
    return true;
  }

  // If there are no entries we are done.
  ELF_Shdr const& sec = this->SectionHeaders[this->DynamicSectionIndex];
  if (sec.sh_entsize == 0) {
    return false;
  }

  // Allocate the dynamic section entries.
  int n = static_cast<int>(sec.sh_size / sec.sh_entsize);
  this->DynamicSectionEntries.resize(n);

  // Read each entry.
  for (int j = 0; j < n; ++j) {
    // Seek to the beginning of the section entry.
    this->Stream.seekg(sec.sh_offset + sec.sh_entsize * j);
    ELF_Dyn& dyn = this->DynamicSectionEntries[j];

    // Try reading the entry.
    if (!this->Read(dyn)) {
      this->SetErrorMessage("Error reading entry from DYNAMIC section.");
      this->DynamicSectionIndex = -1;
      return false;
    }
  }
  return true;
}